

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QByteArray * QtPrivate::convertToUtf8(QLatin1StringView string)

{
  QLatin1StringView in;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  __off_t __length;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype sz;
  QByteArray *ba;
  QByteArray *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  Initialization IVar4;
  QByteArray *this;
  QLatin1String local_18;
  long local_8;
  
  IVar4 = (Initialization)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = QLatin1String::isNull((QLatin1String *)0x512bd2);
  if (bVar1) {
    QByteArray::QByteArray((QByteArray *)0x512be6);
  }
  else {
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::size(&local_18);
    QByteArray::QByteArray(this,(qsizetype)in_RDI,IVar4);
    pcVar2 = QByteArray::data(in_stack_ffffffffffffff80);
    in.m_data = (char *)this;
    in.m_size = (qsizetype)in_RDI;
    pcVar2 = QUtf8::convertFromLatin1(pcVar2,in);
    pcVar3 = QByteArray::data(in_stack_ffffffffffffff80);
    QByteArray::truncate(in_RDI,pcVar2 + -(long)pcVar3,__length);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QByteArray QtPrivate::convertToUtf8(QLatin1StringView string)
{
    if (Q_UNLIKELY(string.isNull()))
        return QByteArray();

    // create a QByteArray with the worst case scenario size
    QByteArray ba(string.size() * 2, Qt::Uninitialized);
    const qsizetype sz = QUtf8::convertFromLatin1(ba.data(), string) - ba.data();
    ba.truncate(sz);

    return ba;
}